

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O1

bool __thiscall cmCTestBuildHandler::IsLaunchedErrorFile(cmCTestBuildHandler *this,char *fname)

{
  int iVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_len = strlen(fname);
  bVar2 = false;
  __str._M_str = "error-";
  __str._M_len = 6;
  local_20._M_str = fname;
  iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_20,0,6,__str);
  if (iVar1 == 0) {
    local_20._M_len = strlen(fname);
    if (local_20._M_len < 4) {
      bVar2 = false;
    }
    else {
      __str_00._M_str = ".xml";
      __str_00._M_len = 4;
      local_20._M_str = fname;
      iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        (&local_20,local_20._M_len - 4,4,__str_00);
      bVar2 = iVar1 == 0;
    }
  }
  return bVar2;
}

Assistant:

bool cmCTestBuildHandler::IsLaunchedErrorFile(const char* fname)
{
  // error-{hash}.xml
  return (cmHasLiteralPrefix(fname, "error-") &&
          cmHasLiteralSuffix(fname, ".xml"));
}